

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

Result file_write(char *filename,FileData *file_data)

{
  FILE *__s;
  size_t sVar1;
  Result RVar2;
  
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    file_write_cold_2();
  }
  else {
    sVar1 = fwrite(file_data->data,file_data->size,1,__s);
    RVar2 = OK;
    if (sVar1 == 1) goto LAB_00104055;
    file_write_cold_1();
  }
  RVar2 = ERROR;
  if (__s == (FILE *)0x0) {
    return ERROR;
  }
LAB_00104055:
  fclose(__s);
  return RVar2;
}

Assistant:

Result file_write(const char* filename, const FileData* file_data) {
  FILE* f = fopen(filename, "wb");
  CHECK_MSG(f, "unable to open file \"%s\".\n", filename);
  CHECK_MSG(fwrite(file_data->data, file_data->size, 1, f) == 1,
            "fwrite failed.\n");
  fclose(f);
  return OK;
  ON_ERROR_CLOSE_FILE_AND_RETURN;
}